

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  LogMessage *pLVar6;
  LogFinisher local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string parameters_1;
  string parameters;
  string error;
  string local_50;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&parameters_1,"--",&local_c9);
    bVar1 = HasPrefixString(&output_directive->name,&parameters_1);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"_out",&local_ca);
      bVar2 = HasSuffixString(&output_directive->name,&local_50);
      if (!bVar2) goto LAB_0023fce5;
LAB_0023fd45:
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
LAB_0023fce5:
      internal::LogMessage::LogMessage
                ((LogMessage *)&parameters,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x5ff);
      pLVar6 = internal::LogMessage::operator<<
                         ((LogMessage *)&parameters,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"Bad name for plugin generator: ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,&output_directive->name);
      internal::LogFinisher::operator=(&local_cb,pLVar6);
      internal::LogMessage::~LogMessage((LogMessage *)&parameters);
      if (bVar1) goto LAB_0023fd45;
    }
    std::__cxx11::string::~string((string *)&parameters_1);
    anon_unknown_0::PluginName(&parameters,&this->plugin_prefix_,&output_directive->name);
    std::__cxx11::string::string((string *)&parameters_1,(string *)&output_directive->parameter);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,&parameters);
    if (pmVar4->_M_string_length != 0) {
      if (parameters_1._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters_1);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->plugin_parameters_,&parameters);
      std::__cxx11::string::append((string *)&parameters_1);
    }
    bVar1 = GeneratePluginOutput
                      (this,parsed_files,&parameters,&parameters_1,generator_context,&error);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&parameters_1);
      goto LAB_0023fdf9;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)&error);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&parameters_1);
  }
  else {
    std::__cxx11::string::string((string *)&parameters,(string *)&output_directive->parameter);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar4->_M_string_length != 0) {
      if (parameters._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append((string *)&parameters);
    }
    iVar3 = (*output_directive->generator->_vptr_CodeGenerator[3])
                      (output_directive->generator,parsed_files,&parameters,generator_context,&error
                      );
    if ((char)iVar3 != '\0') {
LAB_0023fdf9:
      std::__cxx11::string::~string((string *)&parameters);
      bVar1 = true;
      goto LAB_0023fe50;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)&error);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::~string((string *)&parameters);
  bVar1 = false;
LAB_0023fe50:
  std::__cxx11::string::~string((string *)&error);
  return bVar1;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    string plugin_name = PluginName(plugin_prefix_ , output_directive.name);
    string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name,
                              parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!output_directive.generator->GenerateAll(
        parsed_files, parameters, generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}